

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

bool spvIsValidID(char *textValue)

{
  bool bVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if (textValue[lVar2] == '\0') {
      return lVar2 != 0;
    }
    bVar1 = spvIsValidIDCharacter(textValue[lVar2]);
    if (!bVar1) break;
    lVar2 = lVar2 + 1;
  }
  return false;
}

Assistant:

bool spvIsValidID(const char* textValue) {
  const char* c = textValue;
  for (; *c != '\0'; ++c) {
    if (!spvIsValidIDCharacter(*c)) {
      return false;
    }
  }
  // If the string was empty, then the ID also is not valid.
  return c != textValue;
}